

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O2

void mcmuse(mcmcx1def *ctx,mcmon obj)

{
  byte *pbVar1;
  mcmodef *pmVar2;
  ushort uVar3;
  mcmon mVar4;
  mcmon n;
  ulong uVar5;
  undefined6 in_register_00000032;
  uint uVar6;
  
  uVar5 = CONCAT62(in_register_00000032,obj) & 0xffffffff;
  uVar3 = ctx->mcmcxmru;
  n = (mcmon)uVar5;
  if (uVar3 != n) {
    uVar6 = (obj & 0xff) << 5;
    pmVar2 = ctx->mcmcxtab[uVar5 >> 8];
    if ((*(byte *)((long)&pmVar2->mcmoflg + (ulong)uVar6) & 0x10) != 0) {
      mcmunl(ctx,n,&ctx->mcmcxlru);
      uVar3 = ctx->mcmcxmru;
    }
    if (uVar3 == 0xffff) {
      mVar4 = 0xffff;
    }
    else {
      ctx->mcmcxtab[uVar3 >> 8][(byte)uVar3].mcmonxt = n;
      mVar4 = ctx->mcmcxmru;
    }
    *(mcmon *)((long)&pmVar2->mcmoprv + (ulong)uVar6) = mVar4;
    *(undefined2 *)((long)&pmVar2->mcmonxt + (ulong)uVar6) = 0xffff;
    ctx->mcmcxmru = n;
    if (ctx->mcmcxlru == 0xffff) {
      ctx->mcmcxlru = n;
    }
    pbVar1 = (byte *)((long)&pmVar2->mcmoflg + (ulong)uVar6);
    *pbVar1 = *pbVar1 | 0x10;
  }
  return;
}

Assistant:

void mcmuse(mcmcx1def *ctx, mcmon obj)
{
    mcmodef   *o = mcmgobje(ctx, obj);
    
    MCMGLBCTX(ctx);

    if (ctx->mcmcxmru == obj) return;         /* already MRU; nothing to do */
    
    /* remove from LRU chain if it's in it */
    if (o->mcmoflg & MCMOFLRU) mcmunl(ctx, obj, &ctx->mcmcxlru);

    /* set forward pointer of last block, if there is one */
    if (ctx->mcmcxmru != MCMONINV)
        mcmgobje(ctx, ctx->mcmcxmru)->mcmonxt = obj;
    
    o->mcmoprv = ctx->mcmcxmru;               /* point back to previous MRU */
    o->mcmonxt = MCMONINV;                /* nothing in list after this one */
    ctx->mcmcxmru = obj;                          /* point MRU to new block */
    
    /* if there's nothing in the chain at all, set LRU to this block, too */
    if (ctx->mcmcxlru == MCMONINV) ctx->mcmcxlru = obj;

    /* note that object is in LRU chain */
    o->mcmoflg |= MCMOFLRU;
}